

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O2

void __thiscall
stackjit::FunctionDefinition::FunctionDefinition
          (FunctionDefinition *this,string *name,
          vector<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_> *parameters,
          Type *returnType,BytePtr entryPoint,ClassType *classType,AccessModifier accessModifier,
          bool isConstructor)

{
  vector<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_> *this_00;
  string *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::string((string *)this,(string *)name);
  this_00 = &this->mParameters;
  std::vector<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_>::vector
            (this_00,parameters);
  (this->mCallParameters).
  super__Vector_base<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mCallParameters).
  super__Vector_base<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mCallParameters).
  super__Vector_base<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->mReturnType = returnType;
  this->mEntryPoint = entryPoint;
  this->mIsManaged = false;
  this->mIsMemberFunction = classType != (ClassType *)0x0;
  this->mClassType = classType;
  (this->mMemberName)._M_dataplus._M_p = (pointer)&(this->mMemberName).field_2;
  (this->mMemberName)._M_string_length = 0;
  (this->mMemberName).field_2._M_local_buf[0] = '\0';
  this->mAccessModifier = accessModifier;
  this->mIsConstructor = isConstructor;
  this->mIsVirtual = false;
  std::vector<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_>::operator=
            (&this->mCallParameters,this_00);
  if (this->mIsMemberFunction == true) {
    local_50._M_dataplus._M_p = (pointer)this->mClassType;
    std::vector<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_>::_M_insert_rval
              (this_00,(const_iterator)
                       (this->mParameters).
                       super__Vector_base<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_>
                       ._M_impl.super__Vector_impl_data._M_start,(value_type *)&local_50);
    std::__cxx11::string::_M_assign((string *)&this->mMemberName);
    __lhs = ClassType::className_abi_cxx11_(classType);
    std::operator+(&local_70,__lhs,"::");
    std::operator+(&local_50,&local_70,&this->mName);
    std::__cxx11::string::operator=((string *)this,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
  }
  return;
}

Assistant:

FunctionDefinition::FunctionDefinition(
		std::string name,
		std::vector<const Type*> parameters,
		const Type* returnType,
		BytePtr entryPoint,
		const ClassType* classType,
		AccessModifier accessModifier,
		bool isConstructor)
	    : mName(name),
	      mParameters(parameters),
	      mReturnType(returnType),
	      mEntryPoint(entryPoint),
	      mIsManaged(false),
		  mIsMemberFunction(classType != nullptr),
		  mClassType(classType),
		  mAccessModifier(accessModifier),
		  mIsConstructor(isConstructor),
		  mIsVirtual(false) {
		mCallParameters = mParameters;
		if (mIsMemberFunction) {
			mParameters.insert(mParameters.begin(), mClassType);
			mMemberName = mName;
			mName = classType->className() + "::" + mName;
		}
	}